

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O0

UDisplayContext __thiscall
icu_63::LocaleDisplayNamesImpl::getContext(LocaleDisplayNamesImpl *this,UDisplayContextType type)

{
  UDisplayContextType type_local;
  LocaleDisplayNamesImpl *this_local;
  
  if (type == UDISPCTX_TYPE_DIALECT_HANDLING) {
    this_local._4_4_ = this->dialectHandling;
  }
  else if (type == UDISPCTX_TYPE_CAPITALIZATION) {
    this_local._4_4_ = this->capitalizationContext;
  }
  else if (type == UDISPCTX_TYPE_DISPLAY_LENGTH) {
    this_local._4_4_ = this->nameLength;
  }
  else {
    this_local._4_4_ = ULDN_STANDARD_NAMES;
  }
  return this_local._4_4_;
}

Assistant:

UDisplayContext
LocaleDisplayNamesImpl::getContext(UDisplayContextType type) const {
    switch (type) {
        case UDISPCTX_TYPE_DIALECT_HANDLING:
            return (UDisplayContext)dialectHandling;
        case UDISPCTX_TYPE_CAPITALIZATION:
            return capitalizationContext;
        case UDISPCTX_TYPE_DISPLAY_LENGTH:
            return nameLength;
        default:
            break;
    }
    return (UDisplayContext)0;
}